

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void __thiscall
wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::walk
          (Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_> *this,Expression **root)

{
  size_t sVar1;
  pointer pTVar2;
  pointer pTVar3;
  TaskFunc p_Var4;
  long lVar5;
  Expression **ppEVar6;
  
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task,_std::allocator<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task,_std::allocator<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<Gatherer, wasm::Visitor<Gatherer>>::walk(Expression *&) [SubType = Gatherer, VisitorType = wasm::Visitor<Gatherer>]"
                 );
  }
  pushTask(this,PostWalker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::scan,root);
  sVar1 = (this->stack).usedFixed;
  pTVar2 = (this->stack).flexible.
           super__Vector_base<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task,_std::allocator<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (this->stack).flexible.
           super__Vector_base<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task,_std::allocator<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = ((long)pTVar3 - (long)pTVar2 >> 4) + sVar1;
  while( true ) {
    if (lVar5 == 0) {
      return;
    }
    if (pTVar2 == pTVar3) {
      if (sVar1 == 0) {
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                      ,0x7e,
                      "T &wasm::SmallVector<wasm::Walker<Gatherer, wasm::Visitor<Gatherer>>::Task, 10>::back() [T = wasm::Walker<Gatherer, wasm::Visitor<Gatherer>>::Task, N = 10]"
                     );
      }
      p_Var4 = (this->stack).fixed._M_elems[sVar1 - 1].func;
      ppEVar6 = (this->stack).fixed._M_elems[sVar1 - 1].currp;
      (this->stack).usedFixed = sVar1 - 1;
    }
    else {
      p_Var4 = pTVar3[-1].func;
      ppEVar6 = pTVar3[-1].currp;
      (this->stack).flexible.
      super__Vector_base<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task,_std::allocator<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = pTVar3 + -1;
    }
    this->replacep = ppEVar6;
    if (*ppEVar6 == (Expression *)0x0) break;
    (*p_Var4)((Gatherer *)this,ppEVar6);
    sVar1 = (this->stack).usedFixed;
    pTVar2 = (this->stack).flexible.
             super__Vector_base<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task,_std::allocator<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (this->stack).flexible.
             super__Vector_base<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task,_std::allocator<wasm::Walker<Gatherer,_wasm::Visitor<Gatherer,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = ((long)pTVar3 - (long)pTVar2 >> 4) + sVar1;
  }
  __assert_fail("*task.currp",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x132,
                "void wasm::Walker<Gatherer, wasm::Visitor<Gatherer>>::walk(Expression *&) [SubType = Gatherer, VisitorType = wasm::Visitor<Gatherer>]"
               );
}

Assistant:

void walk(Expression*& root) {
    assert(stack.size() == 0);
    pushTask(SubType::scan, &root);
    while (stack.size() > 0) {
      auto task = popTask();
      replacep = task.currp;
      assert(*task.currp);
      task.func(static_cast<SubType*>(this), task.currp);
    }
  }